

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O3

void golf_graphics_update_proj_view_mat(void)

{
  mat4 m1;
  mat4 m2;
  vec3 vVar1;
  vec3 position;
  vec3 v2;
  vec3 up;
  mat4 local_48;
  
  mat4_perspective_projection
            (&local_48,66.0,graphics.viewport_size.x / graphics.viewport_size.y,0.1,150.0);
  graphics.proj_mat.m[0xc] = local_48.m[0xc];
  graphics.proj_mat.m[0xd] = local_48.m[0xd];
  graphics.proj_mat.m[0xe] = local_48.m[0xe];
  graphics.proj_mat.m[0xf] = local_48.m[0xf];
  graphics.proj_mat.m[8] = local_48.m[8];
  graphics.proj_mat.m[9] = local_48.m[9];
  graphics.proj_mat.m[10] = local_48.m[10];
  graphics.proj_mat.m[0xb] = local_48.m[0xb];
  graphics.proj_mat.m[4] = local_48.m[4];
  graphics.proj_mat.m[5] = local_48.m[5];
  graphics.proj_mat.m[6] = local_48.m[6];
  graphics.proj_mat.m[7] = local_48.m[7];
  graphics.proj_mat.m[0] = local_48.m[0];
  graphics.proj_mat.m[1] = local_48.m[1];
  graphics.proj_mat.m[2] = local_48.m[2];
  graphics.proj_mat.m[3] = local_48.m[3];
  vVar1.z = graphics.cam_pos.z;
  vVar1.x = graphics.cam_pos.x;
  vVar1.y = graphics.cam_pos.y;
  v2.z = graphics.cam_dir.z;
  v2.x = graphics.cam_dir.x;
  v2.y = graphics.cam_dir.y;
  vVar1 = vec3_add(vVar1,v2);
  position.z = graphics.cam_pos.z;
  position.x = graphics.cam_pos.x;
  position.y = graphics.cam_pos.y;
  up.z = graphics.cam_up.z;
  up.x = graphics.cam_up.x;
  up.y = graphics.cam_up.y;
  mat4_look_at(&local_48,position,vVar1,up);
  graphics.view_mat.m[0xc] = local_48.m[0xc];
  graphics.view_mat.m[0xd] = local_48.m[0xd];
  graphics.view_mat.m[0xe] = local_48.m[0xe];
  graphics.view_mat.m[0xf] = local_48.m[0xf];
  graphics.view_mat.m[8] = local_48.m[8];
  graphics.view_mat.m[9] = local_48.m[9];
  graphics.view_mat.m[10] = local_48.m[10];
  graphics.view_mat.m[0xb] = local_48.m[0xb];
  graphics.view_mat.m[4] = local_48.m[4];
  graphics.view_mat.m[5] = local_48.m[5];
  graphics.view_mat.m[6] = local_48.m[6];
  graphics.view_mat.m[7] = local_48.m[7];
  graphics.view_mat.m[0] = local_48.m[0];
  graphics.view_mat.m[1] = local_48.m[1];
  graphics.view_mat.m[2] = local_48.m[2];
  graphics.view_mat.m[3] = local_48.m[3];
  m1.m[2] = graphics.proj_mat.m[2];
  m1.m[3] = graphics.proj_mat.m[3];
  m1.m[0] = graphics.proj_mat.m[0];
  m1.m[1] = graphics.proj_mat.m[1];
  m1.m[4] = graphics.proj_mat.m[4];
  m1.m[5] = graphics.proj_mat.m[5];
  m1.m[6] = graphics.proj_mat.m[6];
  m1.m[7] = graphics.proj_mat.m[7];
  m1.m[8] = graphics.proj_mat.m[8];
  m1.m[9] = graphics.proj_mat.m[9];
  m1.m[10] = graphics.proj_mat.m[10];
  m1.m[0xb] = graphics.proj_mat.m[0xb];
  m1.m[0xc] = graphics.proj_mat.m[0xc];
  m1.m[0xd] = graphics.proj_mat.m[0xd];
  m1.m[0xe] = graphics.proj_mat.m[0xe];
  m1.m[0xf] = graphics.proj_mat.m[0xf];
  m2.m[2] = local_48.m[2];
  m2.m[3] = local_48.m[3];
  m2.m[0] = local_48.m[0];
  m2.m[1] = local_48.m[1];
  m2.m[4] = local_48.m[4];
  m2.m[5] = local_48.m[5];
  m2.m[6] = local_48.m[6];
  m2.m[7] = local_48.m[7];
  m2.m[8] = local_48.m[8];
  m2.m[9] = local_48.m[9];
  m2.m[10] = local_48.m[10];
  m2.m[0xb] = local_48.m[0xb];
  m2.m[0xc] = local_48.m[0xc];
  m2.m[0xd] = local_48.m[0xd];
  m2.m[0xe] = local_48.m[0xe];
  m2.m[0xf] = local_48.m[0xf];
  mat4_multiply(m1,m2);
  graphics.proj_view_mat.m[0] = local_48.m[0];
  graphics.proj_view_mat.m[1] = local_48.m[1];
  graphics.proj_view_mat.m[2] = local_48.m[2];
  graphics.proj_view_mat.m[3] = local_48.m[3];
  graphics.proj_view_mat.m[4] = local_48.m[4];
  graphics.proj_view_mat.m[5] = local_48.m[5];
  graphics.proj_view_mat.m[6] = local_48.m[6];
  graphics.proj_view_mat.m[7] = local_48.m[7];
  graphics.proj_view_mat.m[8] = local_48.m[8];
  graphics.proj_view_mat.m[9] = local_48.m[9];
  graphics.proj_view_mat.m[10] = local_48.m[10];
  graphics.proj_view_mat.m[0xb] = local_48.m[0xb];
  graphics.proj_view_mat.m[0xc] = local_48.m[0xc];
  graphics.proj_view_mat.m[0xd] = local_48.m[0xd];
  graphics.proj_view_mat.m[0xe] = local_48.m[0xe];
  graphics.proj_view_mat.m[0xf] = local_48.m[0xf];
  return;
}

Assistant:

void golf_graphics_update_proj_view_mat(void) {
    float near = 0.1f;
    float far = 150.0f;
    graphics.proj_mat = mat4_perspective_projection(66.0f,
            graphics.viewport_size.x / graphics.viewport_size.y, near, far);
    graphics.view_mat = mat4_look_at(graphics.cam_pos,
            vec3_add(graphics.cam_pos, graphics.cam_dir), graphics.cam_up);
    graphics.proj_view_mat = mat4_multiply(graphics.proj_mat, graphics.view_mat);
}